

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

void read_filter_intra_mode_info(AV1_COMMON *cm,MACROBLOCKD *xd,aom_reader *r)

{
  int iVar1;
  long in_RSI;
  FILTER_INTRA_MODE_INFO *filter_intra_mode_info;
  MB_MODE_INFO *mbmi;
  MB_MODE_INFO *mbmi_00;
  AV1_COMMON *cm_00;
  
  cm_00 = (AV1_COMMON *)**(undefined8 **)(in_RSI + 0x1eb8);
  mbmi_00 = (MB_MODE_INFO *)((long)cm_00->buffer_removal_times + 6);
  iVar1 = av1_filter_intra_allowed(cm_00,mbmi_00);
  if (iVar1 == 0) {
    mbmi_00->partition = '\0';
  }
  else {
    iVar1 = aom_read_symbol_((aom_reader *)cm_00,(aom_cdf_prob *)mbmi_00,0);
    mbmi_00->partition = (PARTITION_TYPE)iVar1;
    if (mbmi_00->partition != '\0') {
      iVar1 = aom_read_symbol_((aom_reader *)cm_00,(aom_cdf_prob *)mbmi_00,0);
      mbmi_00->bsize = (BLOCK_SIZE)iVar1;
    }
  }
  return;
}

Assistant:

static void read_filter_intra_mode_info(const AV1_COMMON *const cm,
                                        MACROBLOCKD *const xd, aom_reader *r) {
  MB_MODE_INFO *const mbmi = xd->mi[0];
  FILTER_INTRA_MODE_INFO *filter_intra_mode_info =
      &mbmi->filter_intra_mode_info;

  if (av1_filter_intra_allowed(cm, mbmi)) {
    filter_intra_mode_info->use_filter_intra = aom_read_symbol(
        r, xd->tile_ctx->filter_intra_cdfs[mbmi->bsize], 2, ACCT_STR);
    if (filter_intra_mode_info->use_filter_intra) {
      filter_intra_mode_info->filter_intra_mode = aom_read_symbol(
          r, xd->tile_ctx->filter_intra_mode_cdf, FILTER_INTRA_MODES, ACCT_STR);
    }
  } else {
    filter_intra_mode_info->use_filter_intra = 0;
  }
}